

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

void __thiscall
ECdecoding::queueCheck(ECdecoding *this,array<double,_2UL> *fanoMetrics,array<char,_4UL> *bases)

{
  iterator iter;
  const_iterator last;
  const_iterator first;
  bool bVar1;
  int iVar2;
  type pSVar3;
  size_type sVar4;
  char *key;
  ostream *poVar5;
  logic_error *this_00;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar6;
  reference pvVar7;
  reference this_01;
  int iVar8;
  uint *in_RDI;
  double dVar9;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  *__i;
  iterator iVar10;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  other;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  other_00;
  int reduce_to;
  iterator delete_itr;
  char2double nextProbs;
  SeqEntry *seqEntry;
  iterator __end1;
  iterator __begin1;
  vector<SeqEntry,_std::allocator<SeqEntry>_> *__range1;
  int counter;
  iterator itr;
  vector<SeqEntry,_std::allocator<SeqEntry>_> seqEvals;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  array<char,_4UL> *in_stack_fffffffffffffd00;
  char2double *in_stack_fffffffffffffd08;
  array<double,_2UL> *in_stack_fffffffffffffd10;
  SeqEntry *in_stack_fffffffffffffd18;
  ECdecoding *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  bool local_1ee;
  ECdecoding *in_stack_fffffffffffffe48;
  btree_iterator<const_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  local_188;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *local_178;
  int iStack_170;
  btree_iterator<const_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  local_168;
  int local_154;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *local_150;
  int local_148;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *local_140;
  int iStack_138;
  reference local_f8;
  SeqEntry *local_f0;
  __normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_> local_e8;
  undefined1 *local_e0;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *local_d8;
  int local_d0;
  SeqEntry *local_c8;
  undefined8 uStack_c0;
  SeqEntry *local_b0;
  int local_a8;
  SeqEntry *local_a0;
  int local_98;
  int local_8c;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *local_88;
  int local_80;
  SeqEntry *local_78;
  undefined8 uStack_70;
  SeqEntry *local_60;
  int local_58;
  SeqEntry *local_40;
  int iStack_38;
  undefined4 uStack_34;
  undefined1 local_30 [48];
  SeqEntry *bestSequence;
  
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::vector
            ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)0x1875ac);
  iVar10 = absl::container_internal::
           btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
           ::begin((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                    *)in_stack_fffffffffffffce0);
  bestSequence = (SeqEntry *)iVar10.node_;
  local_58 = iVar10.position_;
  local_60 = bestSequence;
  local_40 = bestSequence;
  iStack_38 = local_58;
  absl::container_internal::
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  ::operator*(in_stack_fffffffffffffce0);
  std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>::operator*
            ((unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)in_stack_fffffffffffffce0);
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back
            ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)in_stack_fffffffffffffcf0,
             (value_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  uStack_70 = CONCAT44(uStack_34,iStack_38);
  local_78 = local_40;
  iVar10.node_._4_4_ = in_stack_fffffffffffffcfc;
  iVar10.node_._0_4_ = in_stack_fffffffffffffcf8;
  iVar10._8_8_ = in_stack_fffffffffffffd00;
  iVar10 = absl::container_internal::
           btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
           ::erase((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                    *)in_stack_fffffffffffffcf0,iVar10);
  local_88 = iVar10.node_;
  local_80 = iVar10.position_;
  local_8c = 0;
  while( true ) {
    bVar1 = absl::container_internal::
            btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
            ::empty((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                     *)0x1876d5);
    local_1ee = false;
    if (!bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      local_1ee = nlohmann::operator<<int,_0>
                            ((int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                             (const_reference)
                             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    }
    if (local_1ee == false) break;
    iVar10 = absl::container_internal::
             btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             ::begin((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                      *)in_stack_fffffffffffffce0);
    local_b0 = (SeqEntry *)iVar10.node_;
    local_a8 = iVar10.position_;
    local_a0 = local_b0;
    local_98 = local_a8;
    local_40 = local_b0;
    iStack_38 = local_a8;
    absl::container_internal::
    btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
    ::operator*(in_stack_fffffffffffffce0);
    pSVar3 = std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>::operator*
                       ((unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)
                        in_stack_fffffffffffffce0);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&pSVar3->seq);
    if (sVar4 == *in_RDI) break;
    absl::container_internal::
    btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
    ::operator*(in_stack_fffffffffffffce0);
    std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>::operator*
              ((unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)in_stack_fffffffffffffce0);
    std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back
              ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)in_stack_fffffffffffffcf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    uStack_c0 = CONCAT44(uStack_34,iStack_38);
    local_c8 = local_40;
    iter.node_._4_4_ = in_stack_fffffffffffffcfc;
    iter.node_._0_4_ = in_stack_fffffffffffffcf8;
    iter._8_8_ = in_stack_fffffffffffffd00;
    iVar10 = absl::container_internal::
             btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             ::erase((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                      *)in_stack_fffffffffffffcf0,iter);
    local_d8 = iVar10.node_;
    in_stack_fffffffffffffdb4 = iVar10.position_;
    local_8c = local_8c + 1;
    local_d0 = in_stack_fffffffffffffdb4;
  }
  local_e0 = local_30;
  local_e8._M_current =
       (SeqEntry *)
       std::vector<SeqEntry,_std::allocator<SeqEntry>_>::begin
                 ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)
                  CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_f0 = (SeqEntry *)
             std::vector<SeqEntry,_std::allocator<SeqEntry>_>::end
                       ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  while (bVar1 = __gnu_cxx::
                 operator==<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>
                           ((__normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_f8 = __gnu_cxx::
               __normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>::
               operator*(&local_e8);
    calcNextProbs(in_stack_fffffffffffffe48,bestSequence);
    metricProbs(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    robin_hood::detail::
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::~Table
              ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                *)0x187a07);
    __gnu_cxx::__normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>::
    operator++(&local_e8);
  }
  key = (char *)absl::container_internal::
                btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                ::size((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                        *)0x187a53);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
  bVar1 = nlohmann::operator><unsigned_long,_0>
                    ((unsigned_long)in_stack_fffffffffffffcf0,
                     (const_reference)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
  ;
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[!] ");
    iVar2 = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
    poVar5 = std::operator<<(poVar5,"reached max queue size.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    in_RDI[0x84] = in_RDI[0x84] + 1;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    bVar1 = nlohmann::operator><int,_0>
                      (iVar2,(const_reference)
                             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    if (bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"maximum queue counter reached.");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    iVar10 = absl::container_internal::
             btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             ::begin((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                      *)in_stack_fffffffffffffce0);
    pbVar6 = iVar10.node_;
    iVar8 = iVar10.position_;
    local_150 = pbVar6;
    local_148 = iVar8;
    local_140 = pbVar6;
    iStack_138 = iVar8;
    pvVar7 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    this_01 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_int<int,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)0x187ce6);
    dVar9 = (double)iVar2;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),key);
    __i = (btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
           *)nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator_double<double,_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)0x187d56);
    local_154 = (int)(dVar9 * (double)__i);
    std::
    advance<absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>&,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>*>,int>
              (__i,in_stack_fffffffffffffcfc);
    local_178 = local_140;
    iStack_170 = iStack_138;
    other.position_ = iStack_138;
    other.node_ = local_140;
    other._12_4_ = 0;
    absl::container_internal::
    btree_iterator<const_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
    ::
    btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*,_0>
              (&local_168,other);
    iVar10 = absl::container_internal::
             btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             ::end((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
                    *)in_stack_fffffffffffffce0);
    in_stack_fffffffffffffcf0 = iVar10.node_;
    other_00._12_4_ = 0;
    other_00.node_ =
         (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          *)SUB128(iVar10._0_12_,0);
    other_00.position_ = SUB124(iVar10._0_12_,8);
    absl::container_internal::
    btree_iterator<const_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_const_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
    ::
    btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*,_0>
              (&local_188,other_00);
    first._8_8_ = in_stack_fffffffffffffd58;
    first.node_ = pbVar6;
    last.position_ = in_stack_fffffffffffffd48;
    last.node_ = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  *)pvVar7;
    last._12_4_ = iVar8;
    absl::container_internal::
    btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
    ::erase((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             *)this_01,first,last);
  }
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::~vector
            ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)in_stack_fffffffffffffcf0);
  return;
}

Assistant:

void ECdecoding::queueCheck(array<double, 2> &fanoMetrics, array<char, 4> &bases) {
    vector<SeqEntry> seqEvals;
    auto itr = queue.begin();
    seqEvals.push_back(**itr);
    queue.erase(itr);
    int counter = 0;
    while (!queue.empty() && counter < config["decode"]["threshold"]["loop"]) {
        itr = queue.begin();
        if ((**itr).seq.size() == messageLen)
            break;
        seqEvals.push_back(**itr);
        queue.erase(itr);
        counter++;
    }

    for (auto &seqEntry: seqEvals) {
        char2double nextProbs = calcNextProbs(seqEntry);
        metricProbs(seqEntry, fanoMetrics, nextProbs, bases);
    }
    if (queue.size() > config["decode"]["queue"]["size"]) {
        WARN("reached max queue size.");
        queueCounter++;
        if (queueCounter > config["decode"]["queue"]["runs"]) { //8 5
            throw logic_error("maximum queue counter reached.");
        }
        auto delete_itr = queue.begin();
        int reduce_to =  static_cast<int>( static_cast<int>( config["decode"]["queue"]["size"])*static_cast<double>( config["decode"]["queue"]["reduce"]));
        advance(delete_itr, reduce_to);
        queue.erase(delete_itr, queue.end());
    }
}